

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t42objs.c
# Opt level: O0

FT_Error T42_Face_Init(FT_Stream stream,FT_Face t42face,FT_Int face_index,FT_Int num_params,
                      FT_Parameter *params)

{
  int iVar1;
  FT_Bitmap_Size *pFVar2;
  undefined8 *puVar3;
  uint uVar4;
  FT_Pointer pvVar5;
  FT_String *pFVar6;
  FT_CMap_Class local_e0;
  FT_CMap_Class clazz;
  T1_CMap_Classes cmap_classes;
  FT_CharMapRec charmap;
  FT_Open_Args args;
  char *family;
  char *full;
  FT_Pointer _tmp_;
  FT_Module module;
  PS_FontInfo info;
  T1_Font type1;
  FT_Face root;
  PSAux_Service psaux;
  FT_Service_PsCMaps psnames;
  FT_Error error;
  T42_Face face;
  FT_Parameter *params_local;
  FT_Int num_params_local;
  FT_Int face_index_local;
  FT_Face t42face_local;
  FT_Stream stream_local;
  
  t42face[3].available_sizes = (FT_Bitmap_Size *)0x0;
  t42face->num_faces = 1;
  pvVar5 = ft_module_get_service(&t42face->driver->root,"postscript-cmaps",'\x01');
  t42face[3].num_glyphs = (FT_Long)pvVar5;
  pFVar6 = (FT_String *)FT_Get_Module_Interface((t42face->driver->root).library,"psaux");
  t42face[3].family_name = pFVar6;
  pFVar6 = t42face[3].family_name;
  if (pFVar6 == (FT_String *)0x0) {
    psnames._4_4_ = 0xb;
  }
  else {
    psnames._4_4_ = T42_Open_Face((T42_Face)t42face);
    if ((psnames._4_4_ == 0) && (-1 < face_index)) {
      if ((face_index & 0xffffU) == 0) {
        iVar1._0_2_ = t42face[2].max_advance_width;
        iVar1._2_2_ = t42face[2].max_advance_height;
        t42face->num_glyphs = (long)iVar1;
        t42face->num_charmaps = 0;
        t42face->face_index = 0;
        t42face->face_flags = t42face->face_flags | 0x211;
        if (*(char *)&t42face[1].style_name != '\0') {
          t42face->face_flags = t42face->face_flags | 4;
        }
        t42face->face_flags = t42face->face_flags | 0x800;
        t42face->family_name = (FT_String *)t42face[1].style_flags;
        t42face->style_name = "Regular";
        if (t42face->family_name == (FT_String *)0x0) {
          if (t42face[2].family_name != (FT_String *)0x0) {
            t42face->family_name = t42face[2].family_name;
          }
        }
        else {
          family = (char *)t42face[1].face_flags;
          args.params = (FT_Parameter *)t42face->family_name;
          if (family != (char *)0x0) {
            while (*family != '\0') {
              if (*family == (char)(args.params)->tag) {
                args.params = (FT_Parameter *)((long)&(args.params)->tag + 1);
                family = family + 1;
              }
              else if ((*family == ' ') || (*family == '-')) {
                family = family + 1;
              }
              else {
                if (((char)(args.params)->tag != ' ') && ((char)(args.params)->tag != '-')) {
                  if ((char)(args.params)->tag == '\0') {
                    t42face->style_name = family;
                  }
                  break;
                }
                args.params = (FT_Parameter *)((long)&(args.params)->tag + 1);
              }
            }
          }
        }
        t42face->num_fixed_sizes = 0;
        t42face->available_sizes = (FT_Bitmap_Size *)0x0;
        charmap.encoding = 9;
        FT_Get_Module((t42face->driver->root).library,"truetype");
        if (num_params != 0) {
          charmap.encoding = charmap.encoding | 0x10;
        }
        psnames._4_4_ =
             FT_Open_Face((t42face->driver->root).library,(FT_Open_Args *)&charmap.encoding,0,
                          (FT_Face *)&t42face[3].available_sizes);
        if (psnames._4_4_ == 0) {
          FT_Done_Size(*(FT_Size *)(t42face[3].available_sizes + 5));
          pFVar2 = t42face[3].available_sizes;
          (t42face->bbox).xMin = pFVar2[3].size;
          (t42face->bbox).yMin = pFVar2[3].x_ppem;
          (t42face->bbox).xMax = pFVar2[3].y_ppem;
          (t42face->bbox).yMax = *(FT_Pos *)(pFVar2 + 4);
          t42face->units_per_EM = (FT_UShort)t42face[3].available_sizes[4].size;
          t42face->ascender = *(FT_Short *)((long)&t42face[3].available_sizes[4].size + 2);
          t42face->descender = *(FT_Short *)((long)&t42face[3].available_sizes[4].size + 4);
          t42face->height = *(FT_Short *)((long)&t42face[3].available_sizes[4].size + 6);
          t42face->max_advance_width = (FT_Short)t42face[3].available_sizes[4].x_ppem;
          t42face->max_advance_height =
               *(FT_Short *)((long)&t42face[3].available_sizes[4].x_ppem + 2);
          t42face->underline_position = *(FT_Short *)((long)&t42face[1].style_name + 2);
          t42face->underline_thickness = *(FT_Short *)((long)&t42face[1].style_name + 4);
          t42face->style_flags = 0;
          if (t42face[1].family_name != (FT_String *)0x0) {
            t42face->style_flags = t42face->style_flags | 1;
          }
          if (((t42face[3].available_sizes)->y_ppem & 2U) != 0) {
            t42face->style_flags = t42face->style_flags | 2;
          }
          if (((t42face[3].available_sizes)->x_ppem & 0x20U) != 0) {
            t42face->face_flags = t42face->face_flags | 0x20;
          }
          if (pvVar5 != (FT_Pointer)0x0) {
            puVar3 = *(undefined8 **)(pFVar6 + 0x40);
            charmap.face._4_2_ = 3;
            charmap.face._6_2_ = 1;
            charmap.face._0_4_ = 0x756e6963;
            cmap_classes = (T1_CMap_Classes)t42face;
            psnames._4_4_ =
                 FT_CMap_New((FT_CMap_Class)puVar3[3],(FT_Pointer)0x0,(FT_CharMap)&cmap_classes,
                             (FT_CMap_conflict *)0x0);
            if ((psnames._4_4_ == 0) || ((psnames._4_4_ & 0xff) == 0xa3)) {
              psnames._4_4_ = 0;
              charmap.face._4_2_ = 7;
              local_e0 = (FT_CMap_Class)0x0;
              uVar4 = *(int *)&t42face[2].style_name - 1;
              if (uVar4 < 3 || *(int *)&t42face[2].style_name == 4) {
                switch((long)&switchD_00351c35::switchdataD_003927d4 +
                       (long)(int)(&switchD_00351c35::switchdataD_003927d4)[uVar4]) {
                case 0x351c37:
                  charmap.face._0_4_ = 0x41444f42;
                  charmap.face._6_2_ = 0;
                  local_e0 = (FT_CMap_Class)*puVar3;
                  break;
                case 0x351c5d:
                  charmap.face._0_4_ = 0x41444245;
                  charmap.face._6_2_ = 1;
                  local_e0 = (FT_CMap_Class)puVar3[1];
                  break;
                case 0x351c84:
                  charmap.face._0_4_ = 0x41444243;
                  charmap.face._6_2_ = 2;
                  local_e0 = (FT_CMap_Class)puVar3[2];
                  break;
                case 0x351cab:
                  charmap.face._0_4_ = 0x6c617431;
                  charmap.face._6_2_ = 3;
                  local_e0 = (FT_CMap_Class)puVar3[3];
                }
              }
              if (local_e0 != (FT_CMap_Class)0x0) {
                psnames._4_4_ =
                     FT_CMap_New(local_e0,(FT_Pointer)0x0,(FT_CharMap)&cmap_classes,
                                 (FT_CMap_conflict *)0x0);
              }
            }
          }
        }
      }
      else {
        psnames._4_4_ = 6;
      }
    }
  }
  return psnames._4_4_;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  T42_Face_Init( FT_Stream      stream,
                 FT_Face        t42face,       /* T42_Face */
                 FT_Int         face_index,
                 FT_Int         num_params,
                 FT_Parameter*  params )
  {
    T42_Face            face  = (T42_Face)t42face;
    FT_Error            error;
    FT_Service_PsCMaps  psnames;
    PSAux_Service       psaux;
    FT_Face             root  = (FT_Face)&face->root;
    T1_Font             type1 = &face->type1;
    PS_FontInfo         info  = &type1->font_info;

    FT_UNUSED( num_params );
    FT_UNUSED( params );
    FT_UNUSED( stream );


    face->ttf_face       = NULL;
    face->root.num_faces = 1;

    FT_FACE_FIND_GLOBAL_SERVICE( face, psnames, POSTSCRIPT_CMAPS );
    face->psnames = psnames;

    face->psaux = FT_Get_Module_Interface( FT_FACE_LIBRARY( face ),
                                           "psaux" );
    psaux = (PSAux_Service)face->psaux;
    if ( !psaux )
    {
      FT_ERROR(( "T42_Face_Init: cannot access `psaux' module\n" ));
      error = FT_THROW( Missing_Module );
      goto Exit;
    }

    FT_TRACE2(( "Type 42 driver\n" ));

    /* open the tokenizer, this will also check the font format */
    error = T42_Open_Face( face );
    if ( error )
      goto Exit;

    /* if we just wanted to check the format, leave successfully now */
    if ( face_index < 0 )
      goto Exit;

    /* check the face index */
    if ( ( face_index & 0xFFFF ) > 0 )
    {
      FT_ERROR(( "T42_Face_Init: invalid face index\n" ));
      error = FT_THROW( Invalid_Argument );
      goto Exit;
    }

    /* Now load the font program into the face object */

    /* Init the face object fields */
    /* Now set up root face fields */

    root->num_glyphs   = type1->num_glyphs;
    root->num_charmaps = 0;
    root->face_index   = 0;

    root->face_flags |= FT_FACE_FLAG_SCALABLE    |
                        FT_FACE_FLAG_HORIZONTAL  |
                        FT_FACE_FLAG_GLYPH_NAMES;

    if ( info->is_fixed_pitch )
      root->face_flags |= FT_FACE_FLAG_FIXED_WIDTH;

#ifdef TT_CONFIG_OPTION_BYTECODE_INTERPRETER
    root->face_flags |= FT_FACE_FLAG_HINTER;
#endif

    /* XXX: TODO -- add kerning with .afm support */

    /* get style name -- be careful, some broken fonts only */
    /* have a `/FontName' dictionary entry!                 */
    root->family_name = info->family_name;
    /* assume "Regular" style if we don't know better */
    root->style_name = (char *)"Regular";
    if ( root->family_name )
    {
      char*  full   = info->full_name;
      char*  family = root->family_name;


      if ( full )
      {
        while ( *full )
        {
          if ( *full == *family )
          {
            family++;
            full++;
          }
          else
          {
            if ( *full == ' ' || *full == '-' )
              full++;
            else if ( *family == ' ' || *family == '-' )
              family++;
            else
            {
              if ( !*family )
                root->style_name = full;
              break;
            }
          }
        }
      }
    }
    else
    {
      /* do we have a `/FontName'? */
      if ( type1->font_name )
        root->family_name = type1->font_name;
    }

    /* no embedded bitmap support */
    root->num_fixed_sizes = 0;
    root->available_sizes = NULL;

    /* Load the TTF font embedded in the T42 font */
    {
      FT_Open_Args  args;


      args.flags       = FT_OPEN_MEMORY | FT_OPEN_DRIVER;
      args.driver      = FT_Get_Module( FT_FACE_LIBRARY( face ),
                                        "truetype" );
      args.memory_base = face->ttf_data;
      args.memory_size = face->ttf_size;

      if ( num_params )
      {
        args.flags     |= FT_OPEN_PARAMS;
        args.num_params = num_params;
        args.params     = params;
      }

      error = FT_Open_Face( FT_FACE_LIBRARY( face ),
                            &args, 0, &face->ttf_face );
    }

    if ( error )
      goto Exit;

    FT_Done_Size( face->ttf_face->size );

    /* Ignore info in FontInfo dictionary and use the info from the  */
    /* loaded TTF font.  The PostScript interpreter also ignores it. */
    root->bbox         = face->ttf_face->bbox;
    root->units_per_EM = face->ttf_face->units_per_EM;

    root->ascender  = face->ttf_face->ascender;
    root->descender = face->ttf_face->descender;
    root->height    = face->ttf_face->height;

    root->max_advance_width  = face->ttf_face->max_advance_width;
    root->max_advance_height = face->ttf_face->max_advance_height;

    root->underline_position  = (FT_Short)info->underline_position;
    root->underline_thickness = (FT_Short)info->underline_thickness;

    /* compute style flags */
    root->style_flags = 0;
    if ( info->italic_angle )
      root->style_flags |= FT_STYLE_FLAG_ITALIC;

    if ( face->ttf_face->style_flags & FT_STYLE_FLAG_BOLD )
      root->style_flags |= FT_STYLE_FLAG_BOLD;

    if ( face->ttf_face->face_flags & FT_FACE_FLAG_VERTICAL )
      root->face_flags |= FT_FACE_FLAG_VERTICAL;

    {
      if ( psnames )
      {
        FT_CharMapRec    charmap;
        T1_CMap_Classes  cmap_classes = psaux->t1_cmap_classes;
        FT_CMap_Class    clazz;


        charmap.face = root;

        /* first of all, try to synthesize a Unicode charmap */
        charmap.platform_id = TT_PLATFORM_MICROSOFT;
        charmap.encoding_id = TT_MS_ID_UNICODE_CS;
        charmap.encoding    = FT_ENCODING_UNICODE;

        error = FT_CMap_New( cmap_classes->unicode, NULL, &charmap, NULL );
        if ( error                                      &&
             FT_ERR_NEQ( error, No_Unicode_Glyph_Name ) )
          goto Exit;
        error = FT_Err_Ok;

        /* now, generate an Adobe Standard encoding when appropriate */
        charmap.platform_id = TT_PLATFORM_ADOBE;
        clazz               = NULL;

        switch ( type1->encoding_type )
        {
        case T1_ENCODING_TYPE_STANDARD:
          charmap.encoding    = FT_ENCODING_ADOBE_STANDARD;
          charmap.encoding_id = TT_ADOBE_ID_STANDARD;
          clazz               = cmap_classes->standard;
          break;

        case T1_ENCODING_TYPE_EXPERT:
          charmap.encoding    = FT_ENCODING_ADOBE_EXPERT;
          charmap.encoding_id = TT_ADOBE_ID_EXPERT;
          clazz               = cmap_classes->expert;
          break;

        case T1_ENCODING_TYPE_ARRAY:
          charmap.encoding    = FT_ENCODING_ADOBE_CUSTOM;
          charmap.encoding_id = TT_ADOBE_ID_CUSTOM;
          clazz               = cmap_classes->custom;
          break;

        case T1_ENCODING_TYPE_ISOLATIN1:
          charmap.encoding    = FT_ENCODING_ADOBE_LATIN_1;
          charmap.encoding_id = TT_ADOBE_ID_LATIN_1;
          clazz               = cmap_classes->unicode;
          break;

        default:
          ;
        }

        if ( clazz )
          error = FT_CMap_New( clazz, NULL, &charmap, NULL );
      }
    }
  Exit:
    return error;
  }